

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bheap.c
# Opt level: O2

int main(int argc,char **argv)

{
  code *pcVar1;
  uint32_t uVar2;
  int iVar3;
  time_t tVar4;
  sx_alloc *alloc;
  sx_bheap *bh;
  int k_1;
  char *pcVar5;
  int k;
  long lVar6;
  int i;
  uint uVar7;
  long lVar8;
  bool bVar9;
  sx_bheap_item sVar10;
  int local_44;
  sx_rng rng;
  
  tVar4 = time((time_t *)0x0);
  sx_rng_seed(&rng,(uint32_t)tVar4);
  alloc = sx_alloc_malloc();
  bh = sx_bheap_create(alloc,0x20);
  puts("\nPushing values to _MIN_ binary heap:");
  iVar3 = 0x20;
  while (iVar3 != 0) {
    uVar2 = sx_rng_gen(&rng);
    uVar7 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar3 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar7);
    sx_bheap_push_min(bh,uVar7,(void *)0x0);
    iVar3 = iVar3 + -1;
  }
  puts("Pop: ");
  iVar3 = 0x20;
  while (iVar3 != 0) {
    sVar10 = sx_bheap_pop_min(bh);
    pcVar5 = "%d - ";
    if (iVar3 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)(uint)sVar10.key,sVar10.user);
    iVar3 = iVar3 + -1;
  }
  puts("\nPushing values to _MAX_ binary heap:");
  iVar3 = 0x20;
  while (iVar3 != 0) {
    uVar2 = sx_rng_gen(&rng);
    uVar7 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar3 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar7);
    sx_bheap_push_max(bh,uVar7,(void *)0x0);
    iVar3 = iVar3 + -1;
  }
  puts("Pop: ");
  iVar3 = 0x20;
  while (iVar3 != 0) {
    sVar10 = sx_bheap_pop_max(bh);
    pcVar5 = "%d - ";
    if (iVar3 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)(uint)sVar10.key,sVar10.user);
    iVar3 = iVar3 + -1;
  }
  puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
  iVar3 = 0;
  local_44 = 0;
  do {
    if (iVar3 == 0x20) {
      puts("Pop Remaining: ");
      iVar3 = 0x20 - local_44;
      if (0x20 - local_44 < 1) {
        iVar3 = 0;
      }
      while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
        sVar10 = sx_bheap_pop_min(bh);
        printf("%d - ",(ulong)(uint)sVar10.key,sVar10.user);
      }
      putchar(10);
      puts("\nPushing values to _MAX_ binary heap with Random pops during push:");
      iVar3 = 0;
      do {
        if (iVar3 == 0x20) {
          puts("Pop Remaining: ");
          iVar3 = 0x20 - local_44;
          if (0x20 - local_44 < 1) {
            iVar3 = 0;
          }
          while (iVar3 != 0) {
            sVar10 = sx_bheap_pop_max(bh);
            printf("%d - ",(ulong)(uint)sVar10.key,sVar10.user);
            iVar3 = iVar3 + -1;
          }
          putchar(10);
          return 0;
        }
        uVar2 = sx_rng_gen(&rng);
        uVar7 = uVar2 % 100 + 1;
        pcVar5 = "%d - ";
        if (iVar3 == 0x1f) {
          pcVar5 = "%d\n";
        }
        printf(pcVar5,(ulong)uVar7);
        sx_bheap_push_max(bh,uVar7,(void *)0x0);
        uVar2 = sx_rng_gen(&rng);
        if (uVar2 % 100 < 0x31) {
          sVar10 = sx_bheap_pop_max(bh);
          lVar8 = 0;
          for (lVar6 = 0; lVar6 < bh->count; lVar6 = lVar6 + 1) {
            if (sVar10.key < *(int *)((long)&bh->items->key + lVar8)) {
              sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                                ,0x5d,"key >= bh->items[k].key");
              pcVar1 = (code *)swi(3);
              iVar3 = (*pcVar1)();
              return iVar3;
            }
            lVar8 = lVar8 + 0x10;
          }
          local_44 = local_44 + 1;
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
    uVar2 = sx_rng_gen(&rng);
    uVar7 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar3 == 0x1f) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar7);
    sx_bheap_push_min(bh,uVar7,(void *)0x0);
    uVar2 = sx_rng_gen(&rng);
    if (uVar2 % 100 < 0x31) {
      sVar10 = sx_bheap_pop_min(bh);
      lVar8 = 0;
      for (lVar6 = 0; lVar6 < bh->count; lVar6 = lVar6 + 1) {
        if (*(int *)((long)&bh->items->key + lVar8) < sVar10.key) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                            ,0x45,"key <= bh->items[k].key");
          pcVar1 = (code *)swi(3);
          iVar3 = (*pcVar1)();
          return iVar3;
        }
        lVar8 = lVar8 + 0x10;
      }
      local_44 = local_44 + 1;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    static const int N = 32;

    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));

    const sx_alloc* alloc = sx_alloc_malloc();
    sx_bheap* bh = sx_bheap_create(alloc, N);

    puts("\nPushing values to _MIN_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MAX_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
    int num_pop = 0;

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_min(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key <= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        printf("%d - ", item.key);
    }
    puts("");

    puts("\nPushing values to _MAX_ binary heap with Random pops during push:");

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_max(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key >= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        printf("%d - ", item.key);
    }
    puts("");

    return 0;
}